

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

u8 read_u8_pair(Emulator *e,MemoryTypeAddressPair pair,Bool raw)

{
  PPUMode PVar1;
  JoypadCallback p_Var2;
  int iVar3;
  JoypadSelect JVar4;
  u8 uVar5;
  byte bVar6;
  Bool BVar7;
  byte bVar8;
  ColorPalettes *pCVar9;
  ushort uVar10;
  ulong uVar12;
  uint uVar11;
  
  uVar12 = (ulong)pair >> 0x20;
  bVar8 = 0xff;
  uVar10 = pair.addr;
  uVar11 = pair._4_4_;
  switch((ulong)pair & 0xffffffff) {
  case 0:
  case 1:
    uVar12 = (ulong)(uVar11 & 0xffff |
                    (e->state).memory_map_state.rom_base[(ulong)pair & 0xffffffff]);
    if (e->cart_info->size <= uVar12) {
      __assert_fail("rom_addr < e->cart_info->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x7a0,"u8 read_u8_pair(Emulator *, MemoryTypeAddressPair, Bool)");
    }
    bVar8 = e->cart_info->data[uVar12];
    break;
  case 2:
    ppu_synchronize(e);
    PVar1 = (e->state).ppu.stat.mode;
    if ((PVar1 != PPU_MODE_MODE3) &&
       ((PVar1 != PPU_MODE_MODE2 || ((e->state).ppu.state_ticks != 4)))) {
      if (0x1fff < (uVar11 & 0xffff)) goto LAB_0010ef92;
      bVar8 = (e->state).vram.data[(ulong)(e->state).vram.offset + (ulong)(uVar11 & 0x1fff)];
    }
    break;
  case 3:
    uVar5 = (*(e->memory_map).read_ext_ram)(e,uVar10);
    return uVar5;
  case 4:
    bVar8 = (e->state).wram.data[uVar12 & 0xffff];
    break;
  case 5:
    bVar8 = (e->state).wram.data[(uVar12 & 0xffff) + (ulong)(e->state).wram.offset];
    break;
  case 6:
    ppu_synchronize(e);
    if (((e->state).ppu.stat.mode2.trigger == FALSE) &&
       (((e->state).ppu.stat.mode & ~PPU_MODE_VBLANK) != PPU_MODE_MODE2)) {
      uVar12 = (ulong)pair >> 0x22 & 0xff;
      switch(uVar11 & 3) {
      case 0:
        bVar8 = (e->state).oam[uVar12].y + 0x10;
        break;
      case 1:
        bVar8 = (e->state).oam[uVar12].x + 8;
        break;
      case 2:
        bVar8 = (e->state).oam[uVar12].tile;
        break;
      case 3:
        bVar8 = (e->state).oam[uVar12].byte3;
      }
    }
    break;
  case 7:
    break;
  case 8:
    iVar3 = (int)(uVar12 & 0xffff);
    switch(iVar3) {
    case 0x40:
      bVar6 = ((byte)(((e->state).ppu.lcdc.bg_tile_data_select & TILE_DATA_8000_8FFF) << 4) |
              (byte)(((e->state).ppu.lcdc.window_display & TRUE) << 5) |
              (byte)(((e->state).ppu.lcdc.window_tile_map_select & TILE_MAP_9C00_9FFF) << 6) |
              (byte)(((e->state).ppu.lcdc.display & TRUE) << 7)) +
              ((byte)(e->state).ppu.lcdc.bg_tile_map_select & 1) * '\b' +
              ((byte)(e->state).ppu.lcdc.obj_size & 1) * '\x04';
      bVar8 = (byte)(e->state).ppu.lcdc.bg_display & 1 |
              (char)(e->state).ppu.lcdc.obj_display * '\x02' & 2U;
      goto LAB_0010ee72;
    case 0x41:
      ppu_synchronize(e);
      bVar8 = (byte)(e->state).ppu.stat.mode & 3 |
              ((byte)(((e->state).ppu.stat.vblank.irq & TRUE) << 4) |
              (byte)(((e->state).ppu.stat.mode2.irq & TRUE) << 5) |
              (byte)(((e->state).ppu.stat.y_compare.irq & TRUE) << 6)) +
              ((byte)(e->state).ppu.stat.hblank.irq & 1) * '\b' +
              ((byte)(e->state).ppu.stat.ly_eq_lyc & 1) * '\x04' | 0x80;
      break;
    case 0x42:
      bVar8 = (e->state).ppu.scy;
      break;
    case 0x43:
      bVar8 = (e->state).ppu.scx;
      break;
    case 0x44:
      ppu_synchronize(e);
      bVar8 = (e->state).ppu.ly;
      break;
    case 0x45:
      bVar8 = (e->state).ppu.lyc;
      break;
    case 0x46:
    case 0x4c:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
      break;
    case 0x47:
    case 0x48:
    case 0x49:
      uVar12 = (ulong)((uVar11 & 0xffff) << 4);
      bVar6 = ((byte)((*(uint *)((e->state).sgb.attr_map + uVar12 + 0x22) & 3) << 4) |
              (byte)(*(int *)((e->state).sgb.attr_map + uVar12 + 0x26) << 6)) +
              ((byte)*(undefined4 *)((e->state).sgb.attr_map + uVar12 + 0x1e) & 3) * '\x04';
      bVar8 = (byte)*(undefined4 *)((e->state).sgb.attr_map + uVar12 + 0x1a) & 3;
LAB_0010ee72:
      bVar8 = bVar8 | bVar6;
      break;
    case 0x4a:
      bVar8 = (e->state).ppu.wy;
      break;
    case 0x4b:
      bVar8 = (e->state).ppu.wx;
      break;
    case 0x4d:
      if ((e->state).is_cgb == FALSE) {
        return 0xff;
      }
      BVar7 = (e->state).cpu_speed.speed;
      bVar8 = (byte)(e->state).cpu_speed.switching;
LAB_0010eede:
      bVar8 = bVar8 & 1 | (byte)(BVar7 << 7) | 0x7e;
      break;
    case 0x4f:
      if ((e->state).is_cgb != FALSE) {
        bVar8 = (e->state).vram.bank | 0xfe;
      }
      break;
    case 0x55:
      if ((e->state).is_cgb != FALSE) {
        bVar8 = (e->state).hdma.blocks;
      }
      break;
    case 0x56:
      if ((e->state).is_cgb != FALSE) {
        bVar8 = (byte)(e->state).infrared.write & 1 |
                (char)((e->state).infrared.enabled << 6) +
                ((byte)(e->state).infrared.read & 1) * '\x02' | 0x3c;
      }
      break;
    case 0x68:
    case 0x6a:
      if ((e->state).is_cgb != FALSE) {
        pCVar9 = &(e->state).ppu.bgcp;
        if (uVar10 != 0x68) {
          pCVar9 = &(e->state).ppu.obcp;
        }
        bVar8 = (char)pCVar9->auto_increment << 7 | pCVar9->index & 0x3f | 0x40;
      }
      break;
    case 0x69:
    case 0x6b:
      if ((e->state).is_cgb != FALSE) {
        pCVar9 = &(e->state).ppu.bgcp;
        if (uVar10 != 0x69) {
          pCVar9 = &(e->state).ppu.obcp;
        }
        bVar8 = pCVar9->data[pCVar9->index];
      }
      break;
    case 0x70:
      if ((e->state).is_cgb == FALSE) {
        return 0xff;
      }
      bVar8 = (e->state).wram.bank;
LAB_0010ef57:
      bVar8 = bVar8 | 0xf8;
      break;
    default:
      switch(uVar12 & 0xffff) {
      case 0:
        p_Var2 = (e->joypad_info).callback;
        if (p_Var2 != (JoypadCallback)0x0) {
          (*p_Var2)(&(e->state).joyp.buttons,(e->joypad_info).user_data);
          (e->state).joyp.last_callback = (e->state).ticks;
        }
        JVar4 = (e->state).joyp.joypad_select;
        bVar8 = read_joyp_p10_p13(e);
        bVar8 = (char)JVar4 << 4 | bVar8 & 0xf | 0xc0;
        break;
      case 1:
        serial_synchronize(e);
        bVar8 = (e->state).serial.sb;
        break;
      case 2:
        serial_synchronize(e);
        bVar8 = (byte)(e->state).serial.clock;
        BVar7 = (e->state).serial.transferring;
        goto LAB_0010eede;
      case 3:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        break;
      case 4:
        timer_synchronize(e);
        bVar8 = *(byte *)((long)&(e->state).timer.div_counter + 1);
        break;
      case 5:
        timer_synchronize(e);
        bVar8 = (e->state).timer.tima;
        break;
      case 6:
        timer_synchronize(e);
        bVar8 = (e->state).timer.tma;
        break;
      case 7:
        bVar8 = ((byte)(e->state).timer.clock_select & 3) + (char)(e->state).timer.on * '\x04';
        goto LAB_0010ef57;
      case 0xf:
        intr_synchronize(e);
        bVar8 = (e->state).interrupt.if_ | 0xe0;
        break;
      default:
        if (iVar3 == 0xff) {
          bVar8 = (e->state).interrupt.ie;
        }
      }
    }
    break;
  case 9:
    apu_synchronize(e);
    if (uVar10 < 0x17) {
      uVar5 = (*(code *)(&DAT_00115bc0 + *(int *)(&DAT_00115bc0 + (uVar12 & 0xffff) * 4)))();
      return uVar5;
    }
    break;
  case 10:
    apu_synchronize(e);
    if ((e->state).apu.channel[2].status == FALSE) {
      uVar12 = uVar12 & 0xffff;
    }
    else {
      if (((e->state).is_cgb == FALSE) && ((e->state).ticks != (e->state).apu.wave.sample_time)) {
        return 0xff;
      }
      uVar12 = (ulong)((e->state).apu.wave.position >> 1);
    }
    bVar8 = (e->state).apu.wave.ram[uVar12];
    break;
  case 0xb:
    bVar8 = (e->state).hram[uVar12 & 0xffff];
    break;
  default:
    read_u8_pair_cold_1();
LAB_0010ef92:
    __assert_fail("addr <= ADDR_MASK_8K",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                  0x684,"u8 read_vram(Emulator *, MaskedAddress)");
  }
  return bVar8;
}

Assistant:

static u8 read_u8_pair(Emulator* e, MemoryTypeAddressPair pair, Bool raw) {
  switch (pair.type) {
    /* Take advantage of the fact that MEMORY_MAP_ROM9 is 0, and ROM1 is 1 when
     * indexing into rom_base. */
    case MEMORY_MAP_ROM0:
    case MEMORY_MAP_ROM1: {
      u32 rom_addr = MMAP_STATE.rom_base[pair.type] | pair.addr;
      assert(rom_addr < e->cart_info->size);
      u8 value = e->cart_info->data[rom_addr];
      if (!raw) {
        HOOK(read_rom_ib, rom_addr, value);
      }
      return value;
    }
    case MEMORY_MAP_VRAM:
      return read_vram(e, pair.addr);
    case MEMORY_MAP_EXT_RAM:
      return e->memory_map.read_ext_ram(e, pair.addr);
    case MEMORY_MAP_WORK_RAM0:
      return WRAM.data[pair.addr];
    case MEMORY_MAP_WORK_RAM1:
      return WRAM.data[WRAM.offset + pair.addr];
    case MEMORY_MAP_OAM:
      return read_oam(e, pair.addr);
    case MEMORY_MAP_UNUSED:
      return INVALID_READ_BYTE;
    case MEMORY_MAP_IO: {
      u8 value = read_io(e, pair.addr);
      HOOK(read_io_asb, pair.addr, get_io_reg_string(pair.addr), value);
      return value;
    }
    case MEMORY_MAP_APU:
      return read_apu(e, pair.addr);
    case MEMORY_MAP_WAVE_RAM:
      return read_wave_ram(e, pair.addr);
    case MEMORY_MAP_HIGH_RAM:
      return HRAM[pair.addr];
    default:
      UNREACHABLE("invalid address: %u 0x%04x.\n", pair.type, pair.addr);
  }
}